

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithreaded_test.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *pCVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer *__ptr;
  int iVar9;
  pointer __p;
  long lVar10;
  bool bVar11;
  initializer_list<chaiscript::Options> __l;
  char *modulepath;
  char *usepath;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> threads;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulepaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usepaths;
  stringstream ss;
  ChaiScript_Basic chai;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  string local_5f8;
  undefined1 local_5d8 [32];
  string local_5b8;
  Exception_Handler local_598;
  pointer local_580;
  char *local_578;
  char *local_570;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> local_568;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f0;
  vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> local_4d8 [5];
  ios_base local_458 [264];
  ChaiScript_Basic local_350;
  
  local_570 = getenv("CHAI_USE_PATH");
  local_578 = getenv("CHAI_MODULE_PATH");
  local_528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_528.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_528,
             (char (*) [1])0x205404);
  if (local_570 != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_528,
               &local_570);
  }
  local_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_548,
             (char (*) [1])0x205404);
  if (local_578 != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_548,
               &local_578);
  }
  pCVar2 = (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
            *)operator_new(0x60);
  chaiscript::parser::
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  ::ChaiScript_Parser(pCVar2);
  local_5d8._0_8_ =
       (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
        *)0x0;
  local_618._M_dataplus._M_p = (pointer)pCVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4f0,&local_548);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_508,&local_528);
  local_5f8._M_dataplus._M_p = (pointer)0x300000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_5f8;
  std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::vector
            (local_4d8,__l,(allocator_type *)&local_5b8);
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (&local_350,
             (unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
              *)&local_618,&local_4f0,&local_508,local_4d8);
  if (local_4d8[0].super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8[0].
                    super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4d8[0].
                          super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d8[0].
                          super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_508);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4f0);
  if ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *)local_618._M_dataplus._M_p !=
      (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *)0x0) {
    (**(code **)(*(long *)local_618._M_dataplus._M_p + 0x20))();
  }
  local_618._M_dataplus._M_p = (pointer)0x0;
  if ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *)local_5d8._0_8_ !=
      (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *)0x0) {
    std::
    default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>
    ::operator()((default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>
                  *)local_5d8,
                 (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                  *)local_5d8._0_8_);
  }
  local_568.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = std::thread::hardware_concurrency();
  iVar9 = 3;
  if (3 < iVar1) {
    iVar9 = iVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Num threads: ",0xd);
  local_580 = (pointer)(ulong)(iVar9 - 1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_4d8[0].super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_4d8[0].
                         super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_4d8,1);
  local_5f8._M_dataplus._M_p = (pointer)0x0;
  do {
    local_618._M_dataplus._M_p = (pointer)&local_350;
    local_4d8[0].super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::thread,std::allocator<std::thread>,void(&)(chaiscript::ChaiScript_Basic&,unsigned_long),std::reference_wrapper<chaiscript::ChaiScript_Basic>,unsigned_long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_4d8[0].
                super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>.
                _M_impl.super__Vector_impl_data._M_finish,(thread **)local_4d8,
               (allocator<std::thread> *)local_5d8,do_work,
               (reference_wrapper<chaiscript::ChaiScript_Basic> *)&local_618,
               (unsigned_long *)&local_5f8);
    std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
    emplace_back<std::shared_ptr<std::thread>>
              ((vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>> *)
               &local_568,(shared_ptr<std::thread> *)local_4d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_4d8[0].super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_4d8[0].
                 super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    local_5f8._M_dataplus._M_p = local_5f8._M_dataplus._M_p + 1;
  } while (local_5f8._M_dataplus._M_p < local_580);
  lVar7 = (long)local_580 << 4;
  lVar10 = 0;
  do {
    std::thread::join();
    lVar10 = lVar10 + 0x10;
  } while (lVar7 != lVar10);
  lVar7 = 0;
  iVar9 = 0;
  do {
    paVar8 = &local_618.field_2;
    std::__cxx11::stringstream::stringstream((stringstream *)local_4d8);
    std::ostream::_M_insert<unsigned_long>
              ((ulong)&local_4d8[0].
                       super__Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::stringbuf::str();
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8,
                     0,0,"getvalue(",9);
    local_618._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_dataplus._M_p == paVar5) {
      local_618.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_618.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_618._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_618.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_618._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_618,")");
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if (paVar5 == paVar6) {
      local_5f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_5f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_5f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_5f8._M_dataplus._M_p = (pointer)paVar5;
    }
    local_5f8._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    local_598.
    super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_598.
    super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"__EVAL__","");
    iVar1 = chaiscript::ChaiScript_Basic::eval<int>(&local_350,&local_5f8,&local_598,&local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_598.
        super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_598.
                 super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_dataplus._M_p != paVar8) {
      operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
    }
    if ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *)local_5d8._0_8_ !=
        (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *)(local_5d8 + 0x10)) {
      operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
    }
    if (iVar1 == 0x2faeb9e0) {
      std::__cxx11::stringbuf::str();
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d8,0,0,"getid(",6);
      local_618._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p == paVar5) {
        local_618.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_618.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_618._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        local_618.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_618._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_618,")");
      local_5f8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p == paVar5) {
        local_5f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_5f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
      }
      else {
        local_5f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_5f8._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      local_598.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_598.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"__EVAL__","");
      iVar1 = chaiscript::ChaiScript_Basic::eval<int>(&local_350,&local_5f8,&local_598,&local_5b8);
      bVar11 = (int)lVar7 == iVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (local_598.
          super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_598.
                   super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p != &local_618.field_2) {
        operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
      }
      if ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *)local_5d8._0_8_ !=
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *)(local_5d8 + 0x10)) {
        operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
      }
      if ((int)lVar7 != iVar1) {
        iVar9 = 1;
      }
    }
    else {
      bVar11 = false;
      iVar9 = 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4d8);
    std::ios_base::~ios_base(local_458);
    if (!bVar11) goto LAB_001962c3;
    lVar7 = lVar7 + 1;
  } while (local_580 != (pointer)lVar7);
  iVar9 = 0;
LAB_001962c3:
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::~vector
            (&local_568);
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&local_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_548);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_528);
  return iVar9;
}

Assistant:

int main() {
// Disable deprecation warning for getenv call.
#ifdef CHAISCRIPT_MSVC
#ifdef max // Why Microsoft? why?
#undef max
#endif
#pragma warning(push)
#pragma warning(disable : 4996)
#endif

  const char *usepath = getenv("CHAI_USE_PATH");
  const char *modulepath = getenv("CHAI_MODULE_PATH");

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

  std::vector<std::string> usepaths;
  usepaths.emplace_back("");
  if (usepath) {
    usepaths.emplace_back(usepath);
  }

  std::vector<std::string> modulepaths;

#ifdef CHAISCRIPT_NO_DYNLOAD
  chaiscript::ChaiScript chai(/* unused */ modulepaths, usepaths);
#else
  modulepaths.emplace_back("");
  if (modulepath) {
    modulepaths.emplace_back(modulepath);
  }

  // For this test we are going to load the dynamic stdlib
  // to make sure it continues to work
  chaiscript::ChaiScript_Basic chai(
      std::make_unique<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Noop_Tracer, chaiscript::optimizer::Optimizer_Default>>(),
      modulepaths,
      usepaths);
#endif

  std::vector<std::shared_ptr<std::thread>> threads;

  // Ensure at least two, but say only 7 on an 8 core processor
  size_t num_threads = static_cast<size_t>(std::max(static_cast<int>(std::thread::hardware_concurrency()) - 1, 2));

  std::cout << "Num threads: " << num_threads << '\n';

  for (size_t i = 0; i < num_threads; ++i) {
    threads.push_back(std::make_shared<std::thread>(do_work, std::ref(chai), i));
  }

  for (size_t i = 0; i < num_threads; ++i) {
    threads[i]->join();
  }

  for (size_t i = 0; i < num_threads; ++i) {
    std::stringstream ss;
    ss << i;
    if (chai.eval<int>("getvalue(" + ss.str() + ")") != expected_value(4000)) {
      return EXIT_FAILURE;
    }

    if (chai.eval<int>("getid(" + ss.str() + ")") != static_cast<int>(i)) {
      return EXIT_FAILURE;
    }
  }

  return EXIT_SUCCESS;
}